

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O2

DecoderResult *
ZXing::Pdf417::DecodeCodewords
          (DecoderResult *__return_storage_ptr__,vector<int,_std::allocator<int>_> *codewords,
          int numECCodewords,vector<int,_std::allocator<int>_> *erasures)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  int a;
  int iVar7;
  int iVar8;
  int iVar9;
  uint extraout_EAX;
  uint uVar10;
  int i;
  ulong uVar11;
  size_type __n;
  long lVar12;
  string *this;
  long lVar13;
  long lVar14;
  int iVar15;
  size_t i_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar17;
  ModulusPoly r;
  vector<int,_std::allocator<int>_> errorLocations;
  ModulusPoly t;
  ModulusPoly rLastLast;
  ModulusPoly sigma;
  ModulusPoly local_358;
  DecoderResult *local_338;
  vector<int,_std::allocator<int>_> S;
  ModulusPoly local_318;
  ModulusPoly local_2f8;
  ModulusPoly omega;
  ModulusPoly poly;
  ModulusPoly tLastLast;
  ModulusPoly syndrome;
  ModulusPoly local_250;
  ModulusPoly local_230;
  ModulusPoly rLast;
  string local_1d8 [152];
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined8 local_12f;
  undefined4 local_127;
  undefined2 local_123;
  char local_121;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined8 local_10f;
  undefined4 local_107;
  undefined2 local_103;
  char local_101;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [16];
  ModulusPoly q;
  Error local_c0;
  Error local_90;
  Error local_60;
  
  if ((codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_100 = local_f0;
    local_60._msg._M_dataplus._M_p = (pointer)&local_60._msg.field_2;
    local_60._msg.field_2._M_local_buf[0] = '\0';
    local_60._msg._M_string_length = 0;
    local_f8 = 0;
    local_f0[0] = 0;
    local_60._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_60._line = 0x23c;
    local_60._type = Format;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this = (string *)&local_100;
    goto LAB_001857c8;
  }
  if (((uint)numECCodewords < 0x201) &&
     ((int)((ulong)((long)(erasures->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(erasures->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2) <= numECCodewords / 2 + 3)) {
    GetModulusGF();
    ModulusPoly::ModulusPoly(&poly,&GetModulusGF::field,codewords);
    uVar11 = (ulong)(uint)numECCodewords;
    std::vector<int,_std::allocator<int>_>::vector(&S,uVar11,(allocator_type *)&rLast);
    lVar13 = 0;
    bVar6 = false;
    uVar16 = extraout_XMM0_Da;
    uVar17 = extraout_XMM0_Db;
    for (; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
      ModulusGF::exp(&GetModulusGF::field,(double)CONCAT44(uVar17,uVar16));
      iVar7 = ModulusPoly::evaluateAt(&poly,a);
      *(int *)((long)S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start + lVar13) = iVar7;
      bVar6 = (bool)(bVar6 | iVar7 != 0);
      lVar13 = lVar13 + 4;
      uVar16 = extraout_XMM0_Da_00;
      uVar17 = extraout_XMM0_Db_00;
    }
    if (bVar6) {
      ModulusPoly::ModulusPoly(&syndrome,&GetModulusGF::field,&S);
      sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sigma._field = (ModulusGF *)0x0;
      sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      omega._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      omega._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      omega._field = (ModulusGF *)0x0;
      omega._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ModulusGF::buildMonomial(&local_2f8,&GetModulusGF::field,numECCodewords,1);
      ModulusPoly::ModulusPoly(&local_318,&syndrome);
      GetModulusGF();
      if ((int)((ulong)((long)local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2) <
          (int)((ulong)((long)local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
        swap(&local_2f8,&local_318);
      }
      ModulusPoly::ModulusPoly(&rLast,&local_2f8);
      ModulusPoly::ModulusPoly(&r,&local_318);
      ModulusPoly::ModulusPoly((ModulusPoly *)&errorLocations,&GetModulusGF::field._zero);
      local_338 = __return_storage_ptr__;
      ModulusPoly::ModulusPoly(&t,&GetModulusGF::field._one);
      while ((int)((uint)numECCodewords >> 1) <
             (int)((ulong)((long)r._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)r._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2)) {
        ModulusPoly::ModulusPoly(&rLastLast,&rLast);
        ModulusPoly::ModulusPoly(&tLastLast,(ModulusPoly *)&errorLocations);
        ModulusPoly::operator=(&rLast,&r);
        ModulusPoly::operator=((ModulusPoly *)&errorLocations,&t);
        bVar6 = ModulusPoly::isZero(&rLast);
        if (bVar6) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&tLastLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&rLastLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
          goto LAB_00185360;
        }
        ModulusPoly::operator=(&r,&rLastLast);
        ModulusPoly::ModulusPoly(&q,&GetModulusGF::field._zero);
        iVar7 = ModulusPoly::coefficient
                          (&rLast,(int)((ulong)((long)rLast._coefficients.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                               (long)rLast._coefficients.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start) >> 2)
                                  + -1);
        iVar7 = ModulusGF::inverse(&GetModulusGF::field,iVar7);
        while( true ) {
          if (((int)((ulong)((long)r._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)r._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) <
               (int)((ulong)((long)rLast._coefficients.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)rLast._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2)) ||
             (bVar6 = ModulusPoly::isZero(&r), bVar6)) break;
          iVar15 = (int)((ulong)((long)r._coefficients.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)r._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
          uVar11 = (long)rLast._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)rLast._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          iVar8 = ModulusPoly::coefficient(&r,iVar15 + -1);
          iVar15 = iVar15 - (int)(uVar11 >> 2);
          iVar8 = ModulusGF::multiply(&GetModulusGF::field,iVar8,iVar7);
          ModulusGF::buildMonomial(&local_358,&GetModulusGF::field,iVar15,iVar8);
          ModulusPoly::add(&local_230,&q,&local_358);
          ModulusPoly::operator=(&q,&local_230);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&local_230._coefficients.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&local_358._coefficients.super__Vector_base<int,_std::allocator<int>_>);
          ModulusPoly::multiplyByMonomial(&local_358,&rLast,iVar15,iVar8);
          ModulusPoly::subtract(&local_230,&r,&local_358);
          ModulusPoly::operator=(&r,&local_230);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&local_230._coefficients.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&local_358._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        }
        ModulusPoly::multiply(&local_250,&q,(ModulusPoly *)&errorLocations);
        ModulusPoly::subtract(&local_358,&local_250,&tLastLast);
        ModulusPoly::negative(&local_230,&local_358);
        ModulusPoly::operator=(&t,&local_230);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_230._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_358._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_250._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&q._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&tLastLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rLastLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      }
      iVar7 = ModulusPoly::coefficient(&t,0);
      if (iVar7 == 0) {
LAB_00185360:
        bVar6 = false;
      }
      else {
        iVar7 = ModulusGF::inverse(&GetModulusGF::field,iVar7);
        ModulusPoly::multiply(&rLastLast,&t,iVar7);
        ModulusPoly::operator=(&sigma,&rLastLast);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rLastLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        ModulusPoly::multiply(&rLastLast,&r,iVar7);
        ModulusPoly::operator=(&omega,&rLastLast);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rLastLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        bVar6 = true;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&t._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&r._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&rLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      if (bVar6) {
        errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        GetModulusGF();
        iVar8 = (int)((ulong)((long)sigma._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
        std::vector<int,_std::allocator<int>_>::resize(&errorLocations,(long)iVar8);
        iVar15 = 0;
        iVar7 = 1;
        while ((iVar7 < GetModulusGF::field._modulus && (iVar15 < iVar8))) {
          iVar9 = ModulusPoly::evaluateAt(&sigma,iVar7);
          if (iVar9 == 0) {
            iVar9 = ModulusGF::inverse(&GetModulusGF::field,iVar7);
            errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar15] = iVar9;
            iVar15 = iVar15 + 1;
          }
          iVar7 = iVar7 + 1;
        }
        if (iVar15 == iVar8) {
          GetModulusGF();
          lVar14 = ((long)sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) * 0x40000000;
          __n = lVar14 + -0x100000000 >> 0x20;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&r,__n,(allocator_type *)&rLast);
          lVar13 = __n * 4;
          for (lVar12 = 1; lVar13 = lVar13 + -4, lVar12 < lVar14 >> 0x20; lVar12 = lVar12 + 1) {
            iVar7 = ModulusPoly::coefficient(&sigma,(int)lVar12);
            iVar7 = ModulusGF::multiply(&GetModulusGF::field,(int)lVar12,iVar7);
            *(int *)((long)r._field + lVar13) = iVar7;
          }
          ModulusPoly::ModulusPoly
                    (&rLast,&GetModulusGF::field,(vector<int,_std::allocator<int>_> *)&r);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&t,
                     (long)errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)errorLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2,(allocator_type *)&rLastLast);
          for (uVar11 = 0;
              uVar11 < (ulong)((long)t._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start - (long)t._field >> 2)
              ; uVar11 = uVar11 + 1) {
            iVar15 = ModulusGF::inverse(&GetModulusGF::field,
                                        errorLocations.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar11]);
            iVar8 = ModulusPoly::evaluateAt(&omega,iVar15);
            iVar7 = -iVar8;
            if (GetModulusGF::field._modulus - iVar8 < GetModulusGF::field._modulus) {
              iVar7 = GetModulusGF::field._modulus - iVar8;
            }
            iVar15 = ModulusPoly::evaluateAt(&rLast,iVar15);
            iVar15 = ModulusGF::inverse(&GetModulusGF::field,iVar15);
            iVar7 = ModulusGF::multiply(&GetModulusGF::field,iVar7,iVar15);
            (&(t._field)->_modulus)[uVar11] = iVar7;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&rLast._coefficients.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&r);
          piVar1 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar2 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = extraout_XMM0_Da_01;
          uVar17 = extraout_XMM0_Db_01;
          for (uVar11 = 0;
              bVar6 = (ulong)((long)errorLocations.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)errorLocations.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar11, !bVar6
              ; uVar11 = uVar11 + 1) {
            dVar5 = ModulusGF::log(&GetModulusGF::field,(double)CONCAT44(uVar17,uVar16));
            uVar16 = SUB84(dVar5,0);
            uVar17 = (undefined4)((ulong)dVar5 >> 0x20);
            uVar10 = ~extraout_EAX + (int)((ulong)((long)piVar1 - (long)piVar2) >> 2);
            if ((int)uVar10 < 0) break;
            piVar3 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = piVar3[uVar10] - (&(t._field)->_modulus)[uVar11];
            iVar7 = iVar15 + GetModulusGF::field._modulus;
            if (iVar7 < GetModulusGF::field._modulus) {
              iVar15 = iVar7;
            }
            piVar3[uVar10] = iVar15;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&t);
        }
        else {
          bVar6 = false;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&errorLocations.super__Vector_base<int,_std::allocator<int>_>);
      }
      else {
        bVar6 = false;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&omega._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&sigma._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&syndrome._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&S.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&poly._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      __return_storage_ptr__ = local_338;
      if (!bVar6) goto LAB_00185742;
    }
    else {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&S.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&poly._coefficients.super__Vector_base<int,_std::allocator<int>_>);
    }
    piVar4 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (long)(codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar4;
    if (0xf < uVar11) {
      iVar7 = (int)(uVar11 >> 2);
      if (*piVar4 <= iVar7) {
        if (*piVar4 + numECCodewords == iVar7) {
LAB_001857f4:
          Decode((DecoderResult *)&rLast,codewords);
          std::__cxx11::to_string
                    ((string *)&errorLocations,
                     (numECCodewords * 100) /
                     (int)((ulong)((long)(codewords->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(codewords->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &errorLocations,"%");
          std::__cxx11::string::operator=(local_1d8,(string *)&r);
          DecoderResult::DecoderResult(__return_storage_ptr__,(DecoderResult *)&rLast);
          std::__cxx11::string::~string((string *)&r);
          std::__cxx11::string::~string((string *)&errorLocations);
          DecoderResult::~DecoderResult((DecoderResult *)&rLast);
          return __return_storage_ptr__;
        }
        if (iVar7 - numECCodewords != 0 && numECCodewords <= iVar7) {
          *piVar4 = iVar7 - numECCodewords;
          goto LAB_001857f4;
        }
      }
    }
    local_140 = &local_130;
    local_c0._msg._M_dataplus._M_p = (pointer)&local_c0._msg.field_2;
    local_c0._msg.field_2._M_local_buf[0] = '\0';
    local_c0._msg.field_2._1_8_ = local_12f;
    local_c0._msg.field_2._9_4_ = local_127;
    local_c0._msg.field_2._13_2_ = local_123;
    local_c0._msg.field_2._M_local_buf[0xf] = local_121;
    local_c0._msg._M_string_length = 0;
    local_138 = 0;
    local_130 = 0;
    local_c0._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_c0._line = 0x243;
    local_c0._type = Format;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    this = (string *)&local_140;
  }
  else {
LAB_00185742:
    local_120 = &local_110;
    local_90._msg._M_dataplus._M_p = (pointer)&local_90._msg.field_2;
    local_90._msg.field_2._M_local_buf[0] = '\0';
    local_90._msg.field_2._1_8_ = local_10f;
    local_90._msg.field_2._9_4_ = local_107;
    local_90._msg.field_2._13_2_ = local_103;
    local_90._msg.field_2._M_local_buf[0xf] = local_101;
    local_90._msg._M_string_length = 0;
    local_118 = 0;
    local_110 = 0;
    local_90._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_90._line = 0x240;
    local_90._type = Checksum;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    this = (string *)&local_120;
  }
LAB_001857c8:
  std::__cxx11::string::~string(this);
  return __return_storage_ptr__;
}

Assistant:

static DecoderResult DecodeCodewords(std::vector<int>& codewords, int numECCodewords, const std::vector<int>& erasures)
{
	if (codewords.empty())
		return FormatError();

	int correctedErrorsCount = 0;
	if (!CorrectErrors(codewords, erasures, numECCodewords, correctedErrorsCount))
		return ChecksumError();

	if (!VerifyCodewordCount(codewords, numECCodewords))
		return FormatError();

	// Decode the codewords
	return Decode(codewords).setEcLevel(std::to_string(numECCodewords * 100 / Size(codewords)) + "%");
}